

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::grabFocus(WindowImplX11 *this)

{
  Display *pDVar1;
  bool bVar2;
  int iVar3;
  Atom AVar4;
  ostream *poVar5;
  string local_168;
  Window local_148;
  Atom local_140;
  undefined4 local_138;
  undefined8 local_130;
  Time local_128;
  XWindowAttributes attr;
  
  bVar2 = anon_unknown.dwarf_56486::ewmhSupported();
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"_NET_ACTIVE_WINDOW",(allocator<char> *)&attr);
    AVar4 = getAtom(&local_168,false);
    std::__cxx11::string::~string((string *)&local_168);
  }
  else {
    AVar4 = 0;
  }
  XGetWindowAttributes(this->m_display,this->m_window,&attr);
  if (attr.map_state != 0) {
    if (AVar4 == 0) {
      XRaiseWindow(this->m_display,this->m_window);
      XSetInputFocus(this->m_display,this->m_window,1,0);
      XFlush(this->m_display);
    }
    else {
      memset(&local_168,0,0xc0);
      local_168._M_dataplus._M_p._0_4_ = 0x21;
      local_148 = this->m_window;
      local_138 = 0x20;
      local_130 = 1;
      local_128 = this->m_lastInputTime;
      pDVar1 = this->m_display;
      local_140 = AVar4;
      iVar3 = XSendEvent(pDVar1,*(undefined8 *)
                                 (*(long *)(pDVar1 + 0xe8) + 0x10 +
                                 (long)*(int *)(pDVar1 + 0xe0) * 0x80),0,0x180000,&local_168);
      XFlush(this->m_display);
      if (iVar3 == 0) {
        poVar5 = err();
        poVar5 = std::operator<<(poVar5,
                                 "Setting fullscreen failed, could not send \"_NET_ACTIVE_WINDOW\" event"
                                );
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
  }
  return;
}

Assistant:

void WindowImplX11::grabFocus()
{
    Atom netActiveWindow = None;

    if (ewmhSupported())
        netActiveWindow = getAtom("_NET_ACTIVE_WINDOW");

    // Only try to grab focus if the window is mapped
    XWindowAttributes attr;

    XGetWindowAttributes(m_display, m_window, &attr);

    if (attr.map_state == IsUnmapped)
        return;

    if (netActiveWindow)
    {
        XEvent event;
        std::memset(&event, 0, sizeof(event));

        event.type = ClientMessage;
        event.xclient.window = m_window;
        event.xclient.format = 32;
        event.xclient.message_type = netActiveWindow;
        event.xclient.data.l[0] = 1; // Normal application
        event.xclient.data.l[1] = m_lastInputTime;
        event.xclient.data.l[2] = 0; // We don't know the currently active window

        int result = XSendEvent(m_display,
                                DefaultRootWindow(m_display),
                                False,
                                SubstructureNotifyMask | SubstructureRedirectMask,
                                &event);

        XFlush(m_display);

        if (!result)
            err() << "Setting fullscreen failed, could not send \"_NET_ACTIVE_WINDOW\" event" << std::endl;
    }
    else
    {
        XRaiseWindow(m_display, m_window);
        XSetInputFocus(m_display, m_window, RevertToPointerRoot, CurrentTime);
        XFlush(m_display);
    }
}